

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O3

void glfwMaximizeWindow(GLFWwindow *handle)

{
  undefined8 uVar1;
  Atom AVar2;
  Atom AVar3;
  Atom AVar4;
  _GLFWwindow *window;
  undefined4 auStack_f0 [8];
  undefined8 uStack_d0;
  Atom AStack_c8;
  undefined4 uStack_c0;
  undefined8 uStack_b8;
  Atom AStack_b0;
  Atom AStack_a8;
  undefined8 uStack_a0;
  
  AVar4 = _glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ;
  AVar3 = _glfw.x11.NET_WM_STATE_MAXIMIZED_VERT;
  AVar2 = _glfw.x11.NET_WM_STATE;
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/src/window.c"
                  ,0x2e4,"void glfwMaximizeWindow(GLFWwindow *)");
  }
  if (_glfw.initialized != 0) {
    if (*(long *)(handle + 0x40) != 0) {
      return;
    }
    if (_glfw.x11.NET_WM_STATE_MAXIMIZED_HORZ != 0 &&
        (_glfw.x11.NET_WM_STATE_MAXIMIZED_VERT != 0 && _glfw.x11.NET_WM_STATE != 0)) {
      uVar1 = *(undefined8 *)(handle + 0x348);
      memset(auStack_f0,0,0xc0);
      auStack_f0[0] = 0x21;
      uStack_c0 = 0x20;
      AStack_c8 = AVar2;
      uStack_b8 = 1;
      AStack_b0 = AVar3;
      AStack_a8 = AVar4;
      uStack_a0 = 1;
      uStack_d0 = uVar1;
      XSendEvent(_glfw.x11.display,_glfw.x11.root,0,0x180000,auStack_f0);
      XFlush(_glfw.x11.display);
    }
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwMaximizeWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfwPlatformMaximizeWindow(window);
}